

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

Command ParseAlias(char *name)

{
  int iVar1;
  size_t __n;
  char *__s1;
  char terminator;
  size_t unbrotli_len;
  char *unbrotli;
  char *name_local;
  
  __n = strlen("unbrotli");
  __s1 = FileName(name);
  iVar1 = strncmp(__s1,"unbrotli",__n);
  if ((iVar1 == 0) && ((__s1[__n] == '\0' || (__s1[__n] == '.')))) {
    name_local._4_4_ = COMMAND_DECOMPRESS;
  }
  else {
    name_local._4_4_ = COMMAND_COMPRESS;
  }
  return name_local._4_4_;
}

Assistant:

static Command ParseAlias(const char* name) {
  /* TODO: cast name to lower case? */
  const char* unbrotli = "unbrotli";
  size_t unbrotli_len = strlen(unbrotli);
  name = FileName(name);
  /* Partial comparison. On Windows there could be ".exe" suffix. */
  if (strncmp(name, unbrotli, unbrotli_len) == 0) {
    char terminator = name[unbrotli_len];
    if (terminator == 0 || terminator == '.') return COMMAND_DECOMPRESS;
  }
  return COMMAND_COMPRESS;
}